

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usbcam.cpp
# Opt level: O2

void __thiscall Webcam::Webcam(Webcam *this,char *devName,uint width,uint height)

{
  size_t sVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  uint *puVar5;
  char *pcVar6;
  int *piVar7;
  undefined8 extraout_RAX;
  long lVar8;
  Webcam *__s;
  ulong uVar9;
  uint uVar10;
  char *__format;
  char *pcVar11;
  v4l2_buf_type *arg;
  FILE *__stream;
  v4l2_buf_type vVar12;
  undefined1 auStack_23c [4];
  Webcam *pWStack_238;
  code *pcStack_230;
  v4l2_buf_type local_224;
  Webcam *local_220;
  ulong local_214;
  undefined4 local_20c;
  undefined8 local_208;
  v4l2_buf_type local_200;
  undefined4 local_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  ulong uStack_1c0;
  ulong local_1b8;
  undefined8 uStack_1b0;
  v4l2_buf_type type;
  undefined4 local_1a4;
  undefined8 local_1a0;
  __nlink_t _Stack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  __dev_t local_180;
  __off_t _Stack_178;
  __blksize_t local_170;
  __blkcnt_t _Stack_168;
  __time_t local_160;
  long lStack_158;
  v4l2_crop crop;
  undefined4 local_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  v4l2_rect local_b0;
  undefined8 local_a0;
  v4l2_capability cap;
  
  arg = (v4l2_buf_type *)(ulong)width;
  this->isOpen = false;
  pcStack_230 = (code *)0x115026;
  dev_name = devName;
  iVar2 = stat(devName,(stat *)&type);
  __stream = _stderr;
  pcVar11 = dev_name;
  if (iVar2 == -1) {
    pcStack_230 = (code *)0x1153a7;
    puVar5 = (uint *)__errno_location();
    uVar10 = *puVar5;
    pcStack_230 = (code *)0x1153b0;
    pcVar6 = strerror(uVar10);
    __format = "Cannot identify \'%s\': %d, %s\n";
  }
  else {
    if (((uint)local_190 & 0xf000) != 0x2000) {
      pcStack_230 = (code *)0x1153d8;
      fprintf(_stderr,"%s is no device\n",dev_name);
      goto LAB_00115412;
    }
    pcStack_230 = (code *)0x11505b;
    iVar2 = open(dev_name,0x802,0);
    __stream = _stderr;
    pcVar11 = dev_name;
    fd = iVar2;
    if (iVar2 != -1) {
      this->isOpen = true;
      pcStack_230 = (code *)0x115081;
      iVar2 = xioctl(iVar2,-0x7f97aa00,&cap);
      if (iVar2 == -1) goto LAB_0011544b;
      if ((cap.capabilities & 1) == 0) {
        pcVar11 = "%s is no video capture device\n";
      }
      else if ((cap.capabilities >> 0x1a & 1) == 0) {
        pcVar11 = "%s does not support streaming i/o\n";
      }
      else {
        local_a0 = 0;
        local_b0.left = 0;
        local_b0.top = 0;
        local_b0.width = 0;
        local_b0.height = 0;
        local_c0 = 0;
        uStack_b8 = 0;
        local_c4 = 1;
        pcStack_230 = (code *)0x1150d1;
        iVar2 = xioctl(fd,-0x3fd3a9c6,&local_c4);
        if (iVar2 == 0) {
          crop.type = 1;
          crop.c.left = local_b0.left;
          crop.c.top = local_b0.top;
          crop.c.width = local_b0.width;
          crop.c.height = local_b0.height;
          pcStack_230 = (code *)0x1150ff;
          xioctl(fd,0x4014563c,&crop);
        }
        __s = (Webcam *)&type;
        pcStack_230 = (code *)0x115116;
        memset(__s,0,0xd0);
        type = V4L2_BUF_TYPE_VIDEO_CAPTURE;
        local_1a0 = CONCAT44(height,width);
        _Stack_198 = 0x447504a4d;
        pcStack_230 = (code *)0x115144;
        iVar2 = xioctl(fd,-0x3f2fa9fb,__s);
        if (iVar2 == -1) {
          pcStack_230 = (code *)0x1154b3;
          errno_exit("VIDIOC_S_FMT");
        }
        else {
          __s = (Webcam *)(local_1a0 & 0xffffffff);
          vVar12 = local_1a0._4_4_;
          uVar10 = (int)local_1a0 * 2;
          uVar3 = (uint)local_190;
          if ((uint)local_190 < uVar10) {
            local_190._0_4_ = uVar10;
            uVar3 = uVar10;
          }
          if (local_190._4_4_ < uVar3 * local_1a0._4_4_) {
            local_190._4_4_ = uVar3 * local_1a0._4_4_;
          }
          local_208 = 0;
          local_214 = 0x100000004;
          local_20c = 1;
          pcStack_230 = (code *)0x1151b3;
          iVar2 = xioctl(fd,-0x3feba9f8,&local_214);
          if (iVar2 != -1) {
            uVar9 = local_214 & 0xffffffff;
            if (1 < uVar9) {
              local_224 = vVar12;
              this = (Webcam *)0x10;
              pcStack_230 = (code *)0x1151e2;
              local_220 = __s;
              buffers = (buffer *)calloc(uVar9,0x10);
              if (buffers == (buffer *)0x0) {
                pcStack_230 = (code *)0x11551a;
                fwrite("Out of memory\n",0xe,1,_stderr);
                goto LAB_001154f6;
              }
              arg = &local_200;
              n_buffers = 0;
              while (n_buffers < (v4l2_buf_type)uVar9) {
                local_1b8 = 0;
                uStack_1b0 = 0;
                uStack_1c0 = 0;
                local_1d8 = 0;
                uStack_1d0 = 0;
                local_1e8 = 0;
                uStack_1e0 = 0;
                local_1f8 = 0;
                uStack_1f0 = 0;
                local_1c8 = 0x100000000;
                pcStack_230 = (code *)0x11524f;
                local_200 = n_buffers;
                local_1fc = 1;
                iVar2 = xioctl(fd,-0x3fa7a9f7,arg);
                if (iVar2 == -1) {
                  pcStack_230 = (code *)0x115433;
                  errno_exit("VIDIOC_QUERYBUF");
LAB_00115433:
                  pcStack_230 = (code *)0x11543f;
                  errno_exit("mmap");
                  goto LAB_0011543f;
                }
                buffers[n_buffers].length = local_1b8 & 0xffffffff;
                pcStack_230 = (code *)0x11528a;
                pvVar4 = mmap((void *)0x0,local_1b8 & 0xffffffff,3,1,fd,uStack_1c0 & 0xffffffff);
                uVar10 = n_buffers;
                uVar9 = (ulong)n_buffers;
                buffers[uVar9].start = pvVar4;
                if (buffers[uVar9].start == (void *)0xffffffffffffffff) goto LAB_00115433;
                uVar9 = local_214 & 0xffffffff;
                n_buffers = uVar10 + V4L2_BUF_TYPE_VIDEO_CAPTURE;
              }
              arg = &type;
              for (vVar12 = 0; vVar12 < n_buffers; vVar12 = vVar12 + V4L2_BUF_TYPE_VIDEO_CAPTURE) {
                local_160 = 0;
                lStack_158 = 0;
                _Stack_168 = 0;
                local_180 = 0;
                _Stack_178 = 0;
                local_190._0_4_ = 0;
                local_190._4_4_ = 0;
                uStack_188._0_4_ = 0;
                uStack_188._4_4_ = 0;
                local_1a0 = 0;
                _Stack_198 = 0;
                local_170 = 0x100000000;
                pcStack_230 = (code *)0x115321;
                type = vVar12;
                local_1a4 = 1;
                iVar2 = xioctl(fd,-0x3fa7a9f1,arg);
                if (iVar2 == -1) goto LAB_0011543f;
              }
              type = V4L2_BUF_TYPE_VIDEO_CAPTURE;
              pcStack_230 = (code *)0x115353;
              iVar2 = xioctl(fd,0x40045612,&type);
              if (iVar2 != -1) {
                sVar1 = buffers->length;
                for (; this != (Webcam *)0x40; this = this + 0x18) {
                  *(v4l2_buf_type *)(this + 0x11c370) = (v4l2_buf_type)sVar1;
                  *(v4l2_buf_type *)(this + 0x11c368) = (v4l2_buf_type)local_220;
                  *(v4l2_buf_type *)(this + 0x11c36c) = local_224;
                }
                return;
              }
              pcStack_230 = (code *)0x115528;
              errno_exit("VIDIOC_STREAMON");
              goto LAB_00115528;
            }
            pcVar11 = "Insufficient buffer memory on %s\n";
            goto LAB_001154ef;
          }
        }
        pcStack_230 = (code *)0x1154b8;
        piVar7 = __errno_location();
        if (*piVar7 != 0x16) {
LAB_00115534:
          pcVar11 = "VIDIOC_REQBUFS";
          pcStack_230 = ~Webcam;
          errno_exit("VIDIOC_REQBUFS");
          if (((Webcam *)pcVar11)->isOpen != true) {
            return;
          }
          pWStack_238 = __s;
          pcStack_230 = (code *)arg;
          stop((Webcam *)pcVar11);
          iVar2 = xioctl(fd,0x40045613,auStack_23c);
          if (iVar2 == -1) {
            errno_exit("VIDIOC_STREAMOFF");
          }
          else {
            uVar9 = 0xffffffffffffffff;
            lVar8 = 8;
            do {
              uVar9 = uVar9 + 1;
              pcVar11 = (char *)buffers;
              if (n_buffers <= uVar9) goto LAB_001155b6;
              iVar2 = munmap(*(void **)((long)buffers + lVar8 + -8),
                             *(size_t *)((long)&buffers->start + lVar8));
              lVar8 = lVar8 + 0x10;
            } while (iVar2 != -1);
            pcVar11 = "munmap";
            errno_exit("munmap");
LAB_001155b6:
            free(pcVar11);
            iVar2 = close(fd);
            if (iVar2 != -1) {
              fd = -1;
              return;
            }
          }
          errno_exit("close");
          __clang_call_terminate(extraout_RAX);
        }
        pcVar11 = "%s does not support memory mapping\n";
      }
LAB_001154ef:
      pcStack_230 = (code *)0x1154f6;
      fprintf(_stderr,pcVar11,dev_name);
LAB_001154f6:
      pcStack_230 = (code *)0x1154fe;
      exit(1);
    }
    pcStack_230 = (code *)0x1153f0;
    puVar5 = (uint *)__errno_location();
    uVar10 = *puVar5;
    pcStack_230 = (code *)0x1153f9;
    pcVar6 = strerror(uVar10);
    __format = "Cannot open \'%s\': %d, %s\n";
  }
  pcStack_230 = (code *)0x115412;
  fprintf(__stream,__format,pcVar11,(ulong)uVar10,pcVar6);
LAB_00115412:
  this->isOpen = false;
  return;
LAB_0011543f:
  pcStack_230 = (code *)0x11544b;
  errno_exit("VIDIOC_QBUF");
LAB_0011544b:
  pcStack_230 = (code *)0x115450;
  piVar7 = __errno_location();
  if (*piVar7 != 0x16) {
LAB_00115528:
    pcStack_230 = (code *)0x115534;
    errno_exit("VIDIOC_QUERYCAP");
    __s = this;
    goto LAB_00115534;
  }
  pcVar11 = "%s is no V4L2 device\n";
  goto LAB_001154ef;
}

Assistant:

Webcam::Webcam(const char *devName, unsigned int width, unsigned int height)
{
    dev_name = (char *)devName;
    if(!open_device()) {
        isOpen = false;
        return;
    }
    isOpen = true;
    init_device (width, height);    //此处 若不适配的分辨率会自动被更正
    start_capturing ();

    for(int i=0; i<2; i++) {
        imgBuffer[i].size = buffers[0].length;
        imgBuffer[i].width  = width;
        imgBuffer[i].height = height;
    }
}